

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

void __thiscall YAML::Scanner::Scanner(Scanner *this,istream *in)

{
  YAML::Stream::Stream(&this->INPUT,in);
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<YAML::Token,_std::allocator<YAML::Token>_>::_M_initialize_map
            ((_Deque_base<YAML::Token,_std::allocator<YAML::Token>_> *)&this->m_tokens,0);
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_simpleKeys).c.
  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  this->m_startedStream = false;
  this->m_endedStream = false;
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  std::_Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>::
  _M_initialize_map((_Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>
                     *)&this->m_simpleKeys,0);
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_indents).c.
  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>::
  _M_initialize_map((_Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
                     *)&this->m_indents,0);
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indentRefs).m_data.
  super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_flows).c.
  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>::
  _M_initialize_map((_Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                     *)&this->m_flows,0);
  return;
}

Assistant:

Scanner::Scanner(std::istream& in)
    : INPUT(in),
      m_tokens{},
      m_startedStream(false),
      m_endedStream(false),
      m_simpleKeyAllowed(false),
      m_canBeJSONFlow(false),
      m_simpleKeys{},
      m_indents{},
      m_indentRefs{},
      m_flows{} {}